

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ServerList.cpp
# Opt level: O0

bool __thiscall RenX_ServerListPlugin::initialize(RenX_ServerListPlugin *this)

{
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  uVar1;
  undefined1 *puVar2;
  pointer pCVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  local_268;
  __sv_type local_260;
  __sv_type local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  __sv_type local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  __sv_type local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  __sv_type local_1c0;
  undefined1 local_1b0 [32];
  __sv_type local_190;
  __sv_type local_180;
  undefined1 local_170 [8];
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  content;
  Server *server;
  undefined8 local_158;
  size_t local_150;
  char *local_148;
  basic_string_view<char,_std::char_traits<char>_> local_140;
  basic_string_view<char,_std::char_traits<char>_> local_130;
  basic_string_view<char,_std::char_traits<char>_> local_120;
  basic_string_view<char,_std::char_traits<char>_> local_110;
  basic_string_view<char,_std::char_traits<char>_> local_100;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  basic_string_view<char,_std::char_traits<char>_> local_e0;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  RenX_ServerListPlugin *local_10;
  RenX_ServerListPlugin *this_local;
  
  puVar2 = &this->field_0x38;
  local_10 = this;
  local_30 = sv("Hostname",8);
  local_40 = sv("",0);
  local_20 = (basic_string_view<char,_std::char_traits<char>_>)
             Jupiter::Config::get
                       (puVar2,local_30._M_len,local_30._M_str,local_40._M_len,local_40._M_str);
  std::__cxx11::string::operator=((string *)&this->m_web_hostname,&local_20);
  local_60 = sv("Path",4);
  local_70 = sv("/",1);
  local_50 = (basic_string_view<char,_std::char_traits<char>_>)
             Jupiter::Config::get
                       (puVar2,local_60._M_len,local_60._M_str,local_70._M_len,local_70._M_str);
  std::__cxx11::string::operator=((string *)&this->m_web_path,&local_50);
  local_90 = sv("ServersPageName",0xf);
  local_a0 = sv("servers",7);
  local_80 = (basic_string_view<char,_std::char_traits<char>_>)
             Jupiter::Config::get
                       (puVar2,local_90._M_len,local_90._M_str,local_a0._M_len,local_a0._M_str);
  std::__cxx11::string::operator=((string *)&this->m_server_list_page_name,&local_80);
  local_c0 = sv("HumanServersPageName",0x14);
  local_d0 = sv("servers_long",0xc);
  local_b0 = (basic_string_view<char,_std::char_traits<char>_>)
             Jupiter::Config::get
                       (puVar2,local_c0._M_len,local_c0._M_str,local_d0._M_len,local_d0._M_str);
  std::__cxx11::string::operator=((string *)&this->m_server_list_long_page_name,&local_b0);
  local_f0 = sv("ServerPageName",0xe);
  local_100 = sv("server",6);
  local_e0 = (basic_string_view<char,_std::char_traits<char>_>)
             Jupiter::Config::get
                       (puVar2,local_f0._M_len,local_f0._M_str,local_100._M_len,local_100._M_str);
  std::__cxx11::string::operator=((string *)&this->m_server_page_name,&local_e0);
  local_120 = sv("MetadataPageName",0x10);
  local_130 = sv("metadata",8);
  local_110 = (basic_string_view<char,_std::char_traits<char>_>)
              Jupiter::Config::get
                        (puVar2,local_120._M_len,local_120._M_str,local_130._M_len,local_130._M_str)
  ;
  std::__cxx11::string::operator=((string *)&this->m_metadata_page_name,&local_110);
  bVar4 = sv("MetadataPrometheusPageName",0x1a);
  bVar5 = sv("metadata_prometheus",0x13);
  local_150 = bVar4._M_len;
  local_148 = bVar4._M_str;
  server = (Server *)bVar5._M_len;
  local_158 = bVar5._M_str;
  local_140 = (basic_string_view<char,_std::char_traits<char>_>)
              Jupiter::Config::get(puVar2,local_150,local_148,server,local_158);
  std::__cxx11::string::operator=((string *)&this->m_metadata_prometheus_page_name,&local_140);
  content._M_t.
  super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  ._M_t.
  super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl =
       (__uniq_ptr_data<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>,_true,_true>
        )getHTTPServer();
  std::
  make_unique<Jupiter::HTTP::Server::Content,std::__cxx11::string&,std::__cxx11::string*(&)(std::basic_string_view<char,std::char_traits<char>>)>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string_view<char,_std::char_traits<char>_>
              *)&this->m_server_list_page_name);
  pCVar3 = std::
           unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           ::operator->((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                         *)local_170);
  *(undefined8 *)(pCVar3 + 0x40) = 2;
  *(undefined8 *)(pCVar3 + 0x48) = 0x1316b4;
  pCVar3 = std::
           unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           ::operator->((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                         *)local_170);
  *(string_view *)(pCVar3 + 0x50) = CONTENT_TYPE_APPLICATION_JSON;
  pCVar3 = std::
           unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           ::operator->((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                         *)local_170);
  *(undefined8 *)(pCVar3 + 0x60) = 5;
  *(undefined8 *)(pCVar3 + 0x68) = 0x1316c8;
  pCVar3 = std::
           unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           ::operator->((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                         *)local_170);
  uVar1 = content;
  pCVar3[8] = (Content)0x0;
  local_180 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)&this->m_web_hostname);
  local_190 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->m_web_path);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  unique_ptr((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
              *)(local_1b0 + 0x18),
             (unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
              *)local_170);
  Jupiter::HTTP::Server::hook
            (uVar1._M_t.
             super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
             ._M_t.
             super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
             .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl,
             local_180._M_len,local_180._M_str,local_190._M_len,local_190._M_str,
             (unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
              *)(local_1b0 + 0x18));
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  ~unique_ptr((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
               *)(local_1b0 + 0x18));
  std::
  make_unique<Jupiter::HTTP::Server::Content,std::__cxx11::string&,std::__cxx11::string*(&)(std::basic_string_view<char,std::char_traits<char>>)>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string_view<char,_std::char_traits<char>_>
              *)&this->m_server_list_long_page_name);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  operator=((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
             *)local_170,
            (unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
             *)local_1b0);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  ~unique_ptr((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
               *)local_1b0);
  pCVar3 = std::
           unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           ::operator->((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                         *)local_170);
  *(undefined8 *)(pCVar3 + 0x40) = 2;
  *(undefined8 *)(pCVar3 + 0x48) = 0x1316b4;
  pCVar3 = std::
           unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           ::operator->((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                         *)local_170);
  *(string_view *)(pCVar3 + 0x50) = CONTENT_TYPE_APPLICATION_JSON;
  pCVar3 = std::
           unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           ::operator->((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                         *)local_170);
  *(undefined8 *)(pCVar3 + 0x60) = 5;
  *(undefined8 *)(pCVar3 + 0x68) = 0x1316c8;
  pCVar3 = std::
           unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           ::operator->((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                         *)local_170);
  uVar1 = content;
  pCVar3[8] = (Content)0x1;
  local_1c0 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)&this->m_web_hostname);
  local_1e0.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->m_web_path);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  unique_ptr((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
              *)&local_1e0._M_string_length,
             (unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
              *)local_170);
  Jupiter::HTTP::Server::hook
            (uVar1._M_t.
             super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
             ._M_t.
             super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
             .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl,
             local_1c0._M_len,local_1c0._M_str,local_1e0.field_2._M_allocated_capacity,
             local_1e0.field_2._8_8_,&local_1e0._M_string_length);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  ~unique_ptr((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
               *)&local_1e0._M_string_length);
  std::
  make_unique<Jupiter::HTTP::Server::Content,std::__cxx11::string&,std::__cxx11::string*(&)(std::basic_string_view<char,std::char_traits<char>>)>
            (&local_1e0,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string_view<char,_std::char_traits<char>_>
              *)&this->m_server_page_name);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  operator=((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
             *)local_170,
            (unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
             *)&local_1e0);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  ~unique_ptr((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
               *)&local_1e0);
  pCVar3 = std::
           unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           ::operator->((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                         *)local_170);
  *(undefined8 *)(pCVar3 + 0x40) = 2;
  *(undefined8 *)(pCVar3 + 0x48) = 0x1316b4;
  pCVar3 = std::
           unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           ::operator->((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                         *)local_170);
  *(string_view *)(pCVar3 + 0x50) = CONTENT_TYPE_APPLICATION_JSON;
  pCVar3 = std::
           unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           ::operator->((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                         *)local_170);
  *(undefined8 *)(pCVar3 + 0x60) = 5;
  *(undefined8 *)(pCVar3 + 0x68) = 0x1316c8;
  pCVar3 = std::
           unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           ::operator->((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                         *)local_170);
  uVar1 = content;
  pCVar3[8] = (Content)0x1;
  local_1f0 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)&this->m_web_hostname);
  local_210.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->m_web_path);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  unique_ptr((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
              *)&local_210._M_string_length,
             (unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
              *)local_170);
  Jupiter::HTTP::Server::hook
            (uVar1._M_t.
             super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
             ._M_t.
             super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
             .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl,
             local_1f0._M_len,local_1f0._M_str,local_210.field_2._M_allocated_capacity,
             local_210.field_2._8_8_,&local_210._M_string_length);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  ~unique_ptr((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
               *)&local_210._M_string_length);
  std::
  make_unique<Jupiter::HTTP::Server::Content,std::__cxx11::string&,std::__cxx11::string*(&)(std::basic_string_view<char,std::char_traits<char>>)>
            (&local_210,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string_view<char,_std::char_traits<char>_>
              *)&this->m_metadata_page_name);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  operator=((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
             *)local_170,
            (unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
             *)&local_210);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  ~unique_ptr((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
               *)&local_210);
  pCVar3 = std::
           unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           ::operator->((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                         *)local_170);
  *(undefined8 *)(pCVar3 + 0x40) = 2;
  *(undefined8 *)(pCVar3 + 0x48) = 0x1316b4;
  pCVar3 = std::
           unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           ::operator->((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                         *)local_170);
  *(string_view *)(pCVar3 + 0x50) = CONTENT_TYPE_APPLICATION_JSON;
  pCVar3 = std::
           unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           ::operator->((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                         *)local_170);
  *(undefined8 *)(pCVar3 + 0x60) = 5;
  *(undefined8 *)(pCVar3 + 0x68) = 0x1316c8;
  pCVar3 = std::
           unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           ::operator->((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                         *)local_170);
  uVar1 = content;
  pCVar3[8] = (Content)0x0;
  local_220 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)&this->m_web_hostname);
  local_240.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->m_web_path);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  unique_ptr((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
              *)&local_240._M_string_length,
             (unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
              *)local_170);
  Jupiter::HTTP::Server::hook
            (uVar1._M_t.
             super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
             ._M_t.
             super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
             .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl,
             local_220._M_len,local_220._M_str,local_240.field_2._M_allocated_capacity,
             local_240.field_2._8_8_,&local_240._M_string_length);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  ~unique_ptr((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
               *)&local_240._M_string_length);
  std::
  make_unique<Jupiter::HTTP::Server::Content,std::__cxx11::string&,std::__cxx11::string*(&)(std::basic_string_view<char,std::char_traits<char>>)>
            (&local_240,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string_view<char,_std::char_traits<char>_>
              *)&this->m_metadata_prometheus_page_name);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  operator=((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
             *)local_170,
            (unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
             *)&local_240);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  ~unique_ptr((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
               *)&local_240);
  pCVar3 = std::
           unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           ::operator->((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                         *)local_170);
  *(undefined8 *)(pCVar3 + 0x40) = 2;
  *(undefined8 *)(pCVar3 + 0x48) = 0x1316b4;
  pCVar3 = std::
           unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           ::operator->((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                         *)local_170);
  *(string_view *)(pCVar3 + 0x50) = CONTENT_TYPE_APPLICATION_JSON;
  pCVar3 = std::
           unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           ::operator->((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                         *)local_170);
  *(undefined8 *)(pCVar3 + 0x60) = 5;
  *(undefined8 *)(pCVar3 + 0x68) = 0x1316c8;
  pCVar3 = std::
           unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           ::operator->((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                         *)local_170);
  uVar1 = content;
  pCVar3[8] = (Content)0x0;
  local_250 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)&this->m_web_hostname);
  local_260 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->m_web_path);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  unique_ptr(&local_268,
             (unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
              *)local_170);
  Jupiter::HTTP::Server::hook
            (uVar1._M_t.
             super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
             ._M_t.
             super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
             .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl,
             local_250._M_len,local_250._M_str,local_260._M_len,local_260._M_str,&local_268);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  ~unique_ptr(&local_268);
  updateServerList(this);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  ~unique_ptr((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
               *)local_170);
  return true;
}

Assistant:

bool RenX_ServerListPlugin::initialize() {
	m_web_hostname = this->config.get("Hostname"sv, ""sv);
	m_web_path = this->config.get("Path"sv, "/"sv);
	m_server_list_page_name = this->config.get("ServersPageName"sv, "servers"sv);
	m_server_list_long_page_name = this->config.get("HumanServersPageName"sv, "servers_long"sv);
	m_server_page_name = this->config.get("ServerPageName"sv, "server"sv);
	m_metadata_page_name = this->config.get("MetadataPageName"sv, "metadata"sv);
	m_metadata_prometheus_page_name = this->config.get("MetadataPrometheusPageName"sv, "metadata_prometheus"sv);

	/** Initialize content */
	Jupiter::HTTP::Server &server = getHTTPServer();

	// Server list page
	std::unique_ptr<Jupiter::HTTP::Server::Content> content = std::make_unique<Jupiter::HTTP::Server::Content>(m_server_list_page_name, handle_server_list_page);
	content->language = Jupiter::HTTP::Content::Language::ENGLISH;
	content->type = CONTENT_TYPE_APPLICATION_JSON;
	content->charset = Jupiter::HTTP::Content::Type::Text::Charset::UTF8;
	content->free_result = false;
	server.hook(m_web_hostname, m_web_path, std::move(content));

	// Server list (long) page
	content = std::make_unique<Jupiter::HTTP::Server::Content>(m_server_list_long_page_name, handle_server_list_long_page);
	content->language = Jupiter::HTTP::Content::Language::ENGLISH;
	content->type = CONTENT_TYPE_APPLICATION_JSON;
	content->charset = Jupiter::HTTP::Content::Type::Text::Charset::UTF8;
	content->free_result = true;
	server.hook(m_web_hostname, m_web_path, std::move(content));

	// Server page (GUIDs)
	content = std::make_unique<Jupiter::HTTP::Server::Content>(m_server_page_name, handle_server_page);
	content->language = Jupiter::HTTP::Content::Language::ENGLISH;
	content->type = CONTENT_TYPE_APPLICATION_JSON;
	content->charset = Jupiter::HTTP::Content::Type::Text::Charset::UTF8;
	content->free_result = true;
	server.hook(m_web_hostname, m_web_path, std::move(content));

	// Metadata page
	content = std::make_unique<Jupiter::HTTP::Server::Content>(m_metadata_page_name, handle_metadata_page);
	content->language = Jupiter::HTTP::Content::Language::ENGLISH;
	content->type = CONTENT_TYPE_APPLICATION_JSON;
	content->charset = Jupiter::HTTP::Content::Type::Text::Charset::UTF8;
	content->free_result = false;
	server.hook(m_web_hostname, m_web_path, std::move(content));

	// Metadata page
	content = std::make_unique<Jupiter::HTTP::Server::Content>(m_metadata_prometheus_page_name, handle_metadata_prometheus_page);
	content->language = Jupiter::HTTP::Content::Language::ENGLISH;
	content->type = CONTENT_TYPE_APPLICATION_JSON;
	content->charset = Jupiter::HTTP::Content::Type::Text::Charset::UTF8;
	content->free_result = false;
	server.hook(m_web_hostname, m_web_path, std::move(content));

	this->updateServerList();
	return true;
}